

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucase.cpp
# Opt level: O3

UChar32 __thiscall
icu_63::FullCaseFoldingIterator::next(FullCaseFoldingIterator *this,UnicodeString *full)

{
  UChar UVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint textLength;
  ulong uVar7;
  UChar *pUVar8;
  ConstChar16Ptr local_28 [3];
  
  iVar5 = this->currentRow;
  iVar2 = this->unfoldRowWidth;
  pUVar8 = this->unfold + iVar2 * iVar5;
  if ((iVar2 <= this->rowCpIndex) || (pUVar8[this->rowCpIndex] == L'\0')) {
    iVar5 = iVar5 + 1;
    this->currentRow = iVar5;
    pUVar8 = pUVar8 + iVar2;
    this->rowCpIndex = this->unfoldStringWidth;
  }
  uVar4 = 0xffffffff;
  if (iVar5 < this->unfoldRows) {
    uVar4 = this->unfoldStringWidth;
    uVar7 = (ulong)uVar4;
    uVar6 = uVar4 + 1;
    do {
      textLength = (int)uVar4 >> 0x1f & uVar4;
      if ((int)uVar7 < 1) break;
      uVar6 = uVar6 - 1;
      lVar3 = uVar7 - 1;
      uVar7 = uVar7 - 1;
      textLength = uVar6;
    } while (pUVar8[lVar3] == L'\0');
    local_28[0].p_ = pUVar8;
    UnicodeString::setTo(full,'\0',local_28,textLength);
    iVar5 = this->rowCpIndex;
    this->rowCpIndex = iVar5 + 1;
    UVar1 = pUVar8[iVar5];
    uVar4 = (uint)(ushort)UVar1;
    if ((UVar1 & 0xfc00U) == 0xd800) {
      this->rowCpIndex = iVar5 + 2;
      uVar4 = (uint)(ushort)UVar1 * 0x400 + (uint)(ushort)pUVar8[(long)iVar5 + 1] + 0xfca02400;
    }
  }
  return uVar4;
}

Assistant:

UChar32
FullCaseFoldingIterator::next(UnicodeString &full) {
    // Advance past the last-delivered code point.
    const UChar *p=unfold+(currentRow*unfoldRowWidth);
    if(rowCpIndex>=unfoldRowWidth || p[rowCpIndex]==0) {
        ++currentRow;
        p+=unfoldRowWidth;
        rowCpIndex=unfoldStringWidth;
    }
    if(currentRow>=unfoldRows) { return U_SENTINEL; }
    // Set "full" to the NUL-terminated string in the first unfold column.
    int32_t length=unfoldStringWidth;
    while(length>0 && p[length-1]==0) { --length; }
    full.setTo(FALSE, p, length);
    // Return the code point.
    UChar32 c;
    U16_NEXT_UNSAFE(p, rowCpIndex, c);
    return c;
}